

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O3

void duckdb::UnaryExecutor::
     ExecuteLoop<duckdb::interval_t,duckdb::string_t,duckdb::GenericUnaryWrapper,duckdb::VectorStringCastOperator<duckdb::StringCast>>
               (interval_t *ldata,string_t *result_data,idx_t count,SelectionVector *sel_vector,
               ValidityMask *mask,ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  anon_struct_16_3_d7536bce_for_pointer *paVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  sel_t *psVar4;
  undefined4 uVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  undefined4 uVar6;
  byte bVar7;
  element_type *peVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  ulong uVar10;
  undefined8 uVar11;
  TemplatedValidityData<unsigned_long> *pTVar12;
  _Head_base<0UL,_unsigned_long_*,_false> _Var13;
  idx_t idx_in_entry;
  ulong uVar14;
  char **ppcVar15;
  string_t sVar16;
  interval_t input;
  interval_t input_00;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  buffer_ptr<ValidityBuffer> *local_48;
  ValidityMask *local_40;
  idx_t local_38;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      psVar4 = sel_vector->sel_vector;
      ppcVar15 = &(result_data->value).pointer.ptr;
      uVar14 = 0;
      do {
        uVar10 = uVar14;
        if (psVar4 != (sel_t *)0x0) {
          uVar10 = (ulong)psVar4[uVar14];
        }
        uVar3 = ldata[uVar10].months;
        uVar6 = ldata[uVar10].days;
        input_00.days = uVar6;
        input_00.months = uVar3;
        input_00.micros = ldata[uVar10].micros;
        sVar16 = StringCast::Operation<duckdb::interval_t>(input_00,(Vector *)dataptr);
        uVar11 = sVar16.value._0_8_;
        paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar15 + -1);
        paVar1->length = (int)uVar11;
        paVar1->prefix[0] = (char)((ulong)uVar11 >> 0x20);
        paVar1->prefix[1] = (char)((ulong)uVar11 >> 0x28);
        paVar1->prefix[2] = (char)((ulong)uVar11 >> 0x30);
        paVar1->prefix[3] = (char)((ulong)uVar11 >> 0x38);
        *ppcVar15 = sVar16.value._8_8_;
        uVar14 = uVar14 + 1;
        ppcVar15 = ppcVar15 + 2;
      } while (count != uVar14);
    }
  }
  else if (count != 0) {
    psVar4 = sel_vector->sel_vector;
    local_48 = &(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data;
    ppcVar15 = &(result_data->value).pointer.ptr;
    uVar14 = 0;
    local_40 = mask;
    do {
      uVar10 = uVar14;
      if (psVar4 != (sel_t *)0x0) {
        uVar10 = (ulong)psVar4[uVar14];
      }
      if (((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask[uVar10 >> 6] >>
           (uVar10 & 0x3f) & 1) == 0) {
        _Var13._M_head_impl =
             (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (_Var13._M_head_impl == (unsigned_long *)0x0) {
          local_38 = (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_58,&local_38);
          p_Var9 = p_Stack_50;
          peVar8 = local_58;
          local_58 = (element_type *)0x0;
          p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar8;
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var9;
          if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
             p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
          }
          pTVar12 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (local_48);
          _Var13._M_head_impl =
               (pTVar12->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               _Var13._M_head_impl;
          mask = local_40;
        }
        bVar7 = (byte)uVar14 & 0x3f;
        _Var13._M_head_impl[uVar14 >> 6] =
             _Var13._M_head_impl[uVar14 >> 6] & (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7)
        ;
      }
      else {
        uVar2 = ldata[uVar10].months;
        uVar5 = ldata[uVar10].days;
        input.days = uVar5;
        input.months = uVar2;
        input.micros = ldata[uVar10].micros;
        sVar16 = StringCast::Operation<duckdb::interval_t>(input,(Vector *)dataptr);
        uVar11 = sVar16.value._0_8_;
        paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar15 + -1);
        paVar1->length = (int)uVar11;
        paVar1->prefix[0] = (char)((ulong)uVar11 >> 0x20);
        paVar1->prefix[1] = (char)((ulong)uVar11 >> 0x28);
        paVar1->prefix[2] = (char)((ulong)uVar11 >> 0x30);
        paVar1->prefix[3] = (char)((ulong)uVar11 >> 0x38);
        *ppcVar15 = sVar16.value._8_8_;
      }
      uVar14 = uVar14 + 1;
      ppcVar15 = ppcVar15 + 2;
    } while (count != uVar14);
  }
  return;
}

Assistant:

static inline void ExecuteLoop(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               const SelectionVector *__restrict sel_vector, ValidityMask &mask,
	                               ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
#ifdef DEBUG
		// ldata may point to a compressed dictionary buffer which can be smaller than ldata + count
		idx_t max_index = 0;
		for (idx_t i = 0; i < count; i++) {
			auto idx = sel_vector->get_index(i);
			max_index = MaxValue(max_index, idx);
		}
		ASSERT_RESTRICT(ldata, ldata + max_index, result_data, result_data + count);
#endif

		if (!mask.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				if (mask.RowIsValidUnsafe(idx)) {
					result_data[i] =
					    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
				} else {
					result_mask.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
			}
		}
	}